

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O3

span<int,_18446744073709551615UL> __thiscall
nonstd::span_lite::span<int,_18446744073709551615UL>::last
          (span<int,_18446744073709551615UL> *this,size_type count)

{
  logic_error *this_00;
  ulong in_RDX;
  size_type extraout_RDX;
  span<int,_18446744073709551615UL> sVar1;
  span<int,_18446744073709551615UL> local_20;
  
  if (in_RDX <= *(ulong *)(count + 8)) {
    span(&local_20,(pointer)((*(ulong *)(count + 8) - in_RDX) * 4 + *(long *)count),in_RDX);
    this->data_ = local_20.data_;
    this->size_ = local_20.size_;
    sVar1.size_ = extraout_RDX;
    sVar1.data_ = (pointer)this;
    return sVar1;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  detail::contract_violation::contract_violation
            ((contract_violation *)&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]span-lite/include/nonstd/span.hpp:1198: Precondition violation."
            );
  std::logic_error::logic_error(this_00,(logic_error *)&local_20);
  *(undefined ***)this_00 = &PTR__logic_error_001b6c70;
  __cxa_throw(this_00,&detail::contract_violation::typeinfo,std::logic_error::~logic_error);
}

Assistant:

span_constexpr_exp span< element_type, dynamic_extent >
    last( size_type count ) const
    {
        span_EXPECTS( detail::is_positive( count ) && count <= size() );

        return span< element_type, dynamic_extent >( data() + ( size() - count ), count );
    }